

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CURLSession.cpp
# Opt level: O0

void __thiscall CURLSession::set_credentials(CURLSession *this,string *username,string *password)

{
  bool bVar1;
  pointer pvVar2;
  undefined8 uVar3;
  string *password_local;
  string *username_local;
  CURLSession *this_local;
  
  bVar1 = std::operator!=(&this->m_handle,(nullptr_t)0x0);
  if (!bVar1) {
    __assert_fail("m_handle != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/adrian-007[P]camera_streamer/src/CURLSession.cpp"
                  ,0x1e,
                  "void CURLSession::set_credentials(const std::string &, const std::string &)");
  }
  pvVar2 = std::unique_ptr<void,_void_(*)(void_*)>::get(&this->m_handle);
  curl_easy_setopt(pvVar2,0x6b,1);
  pvVar2 = std::unique_ptr<void,_void_(*)(void_*)>::get(&this->m_handle);
  uVar3 = std::__cxx11::string::c_str();
  curl_easy_setopt(pvVar2,0x27bd,uVar3);
  pvVar2 = std::unique_ptr<void,_void_(*)(void_*)>::get(&this->m_handle);
  uVar3 = std::__cxx11::string::c_str();
  curl_easy_setopt(pvVar2,0x27be,uVar3);
  return;
}

Assistant:

void CURLSession::set_credentials(const std::string& username, const std::string& password)
{
    assert(m_handle != nullptr);

    curl_easy_setopt(m_handle.get(), CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
    curl_easy_setopt(m_handle.get(), CURLOPT_USERNAME, username.c_str());
    curl_easy_setopt(m_handle.get(), CURLOPT_PASSWORD, password.c_str());
}